

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int set_sort(lyxp_set *set,lyd_node *cur_node,int options)

{
  ulong uVar1;
  undefined8 *puVar2;
  lyxp_set_node *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint32_t uVar9;
  lyd_node *plVar10;
  uint uVar11;
  lyxp_set_node *item1;
  long lVar12;
  long lVar13;
  ulong uVar14;
  lyxp_set_node item;
  lyxp_node_type local_5c;
  lyd_node *plStack_58;
  lyxp_node_type root_type;
  undefined8 local_50;
  lyxp_set_hash_node hnode;
  
  iVar7 = 0;
  if ((set->type == LYXP_SET_NODE_SET) && (set->used != 1)) {
    plVar10 = moveto_get_root(cur_node,options,&local_5c);
    iVar7 = set_assign_pos(set,plVar10,local_5c);
    if (iVar7 == 0) {
      plStack_58 = plVar10;
      ly_log_dbg(8,"SORT BEGIN");
      print_set_debug(set);
      uVar11 = 0;
      uVar8 = set->used;
      unique0x1000046f = set;
      do {
        if (uVar8 <= uVar11) break;
        lVar12 = 0x10;
        lVar13 = 1;
        bVar6 = false;
        hnode.node._4_4_ = 0;
        uVar14 = 0;
        while (uVar1 = uVar14 + 1, uVar1 < uVar8 - uVar11) {
          plVar3 = (set->val).nodes;
          item1 = (lyxp_set_node *)((long)&plVar3[-1].node + lVar12);
          if (bVar6) {
            iVar7 = set_sort_compare((lyxp_set_node *)((long)&plVar3->node + lVar12),item1,
                                     plStack_58);
            if (-1 < iVar7) goto LAB_0016fa22;
LAB_0016f9ea:
            plVar3 = (stack0xffffffffffffffc0->val).nodes;
            plVar10 = plVar3[uVar14].node;
            uVar4 = *(undefined8 *)&plVar3[uVar14].type;
            puVar2 = (undefined8 *)((long)&plVar3->node + lVar12);
            uVar5 = puVar2[1];
            plVar3 = plVar3 + uVar14;
            plVar3->node = (lyd_node *)*puVar2;
            plVar3->type = (int)uVar5;
            plVar3->pos = (int)((ulong)uVar5 >> 0x20);
            puVar2 = (undefined8 *)((long)&((stack0xffffffffffffffc0->val).nodes)->node + lVar12);
            *puVar2 = plVar10;
            puVar2[1] = uVar4;
            hnode.node._4_4_ = 1;
          }
          else {
            iVar7 = set_sort_compare(item1,(lyxp_set_node *)((long)&plVar3->node + lVar12),
                                     plStack_58);
            if (0 < iVar7) {
              uVar14 = lVar13 - 1;
              goto LAB_0016f9ea;
            }
LAB_0016fa22:
            bVar6 = !bVar6;
          }
          lVar13 = lVar13 + 1;
          lVar12 = lVar12 + 0x10;
          uVar14 = uVar1;
          set = stack0xffffffffffffffc0;
          uVar8 = stack0xffffffffffffffc0->used;
        }
        uVar11 = uVar11 + 1;
      } while (hnode.node._4_4_ != 0);
      ly_log_dbg(8,"SORT END %d");
      print_set_debug(stack0xffffffffffffffc0);
      if (3 < stack0xffffffffffffffc0->used) {
        if (stack0xffffffffffffffc0->ht == (hash_table *)0x0) {
          __assert_fail("set->ht",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x604,"int set_sort(struct lyxp_set *, const struct lyd_node *, int)");
        }
        uVar14 = 0xffffffffffffffff;
        lVar12 = 8;
        while (uVar14 = uVar14 + 1, uVar14 < stack0xffffffffffffffc0->used) {
          local_50 = *(undefined8 *)((long)(stack0xffffffffffffffc0->val).nodes + lVar12 + -8);
          hnode.node._0_4_ =
               *(undefined4 *)((long)&((stack0xffffffffffffffc0->val).nodes)->node + lVar12);
          uVar9 = dict_hash_multi(0,(char *)&local_50,8);
          uVar9 = dict_hash_multi(uVar9,(char *)&hnode,4);
          uVar9 = dict_hash_multi(uVar9,(char *)0x0,0);
          iVar7 = lyht_find(stack0xffffffffffffffc0->ht,&local_50,uVar9,(void **)0x0);
          lVar12 = lVar12 + 0x10;
          if (iVar7 != 0) {
            __assert_fail("!lyht_find(set->ht, &hnode, hash, NULL)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x60d,"int set_sort(struct lyxp_set *, const struct lyd_node *, int)");
          }
        }
      }
      iVar7 = uVar11 - 1;
    }
    else {
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

static int
set_sort(struct lyxp_set *set, const struct lyd_node *cur_node, int options)
{
    uint32_t i, j;
    int ret = 0, cmp, inverted, change;
    const struct lyd_node *root;
    enum lyxp_node_type root_type;
    struct lyxp_set_node item;

    if ((set->type != LYXP_SET_NODE_SET) || (set->used == 1)) {
        return 0;
    }

    /* get root */
    root = moveto_get_root(cur_node, options, &root_type);

    /* fill positions */
    if (set_assign_pos(set, root, root_type)) {
        return -1;
    }

    LOGDBG(LY_LDGXPATH, "SORT BEGIN");
    print_set_debug(set);

    for (i = 0; i < set->used; ++i) {
        inverted = 0;
        change = 0;

        for (j = 1; j < set->used - i; ++j) {
            /* compare node positions */
            if (inverted) {
                cmp = set_sort_compare(&set->val.nodes[j], &set->val.nodes[j - 1], root);
            } else {
                cmp = set_sort_compare(&set->val.nodes[j - 1], &set->val.nodes[j], root);
            }

            /* swap if needed */
            if ((inverted && (cmp < 0)) || (!inverted && (cmp > 0))) {
                change = 1;

                item = set->val.nodes[j - 1];
                set->val.nodes[j - 1] = set->val.nodes[j];
                set->val.nodes[j] = item;
            } else {
                /* whether node_pos1 should be smaller than node_pos2 or the other way around */
                inverted = !inverted;
            }
        }

        ++ret;

        if (!change) {
            break;
        }
    }

    LOGDBG(LY_LDGXPATH, "SORT END %d", ret);
    print_set_debug(set);

#ifdef LY_ENABLED_CACHE
    struct lyxp_set_hash_node hnode;
    uint64_t hash;

    /* check node hashes */
    if (set->used >= LY_CACHE_HT_MIN_CHILDREN) {
        assert(set->ht);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = dict_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = dict_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = dict_hash_multi(hash, NULL, 0);

            assert(!lyht_find(set->ht, &hnode, hash, NULL));
        }
    }
#endif

    return ret - 1;
}